

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  int iVar1;
  long lVar2;
  FdOutputStream out;
  FdInputStream in;
  int fds [2];
  byte buf [6];
  Fault f;
  FdOutputStream local_e8;
  FdInputStream local_d8;
  int local_c8 [2];
  uchar local_c0 [8];
  OwnFd local_b8;
  OwnFd local_b4;
  DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> local_b0;
  ArrayPtr<unsigned_char> local_78;
  ArrayPtr<const_unsigned_char> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined3 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined3 *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_c8[0] = 0;
  local_c8[1] = 0;
  do {
    iVar1 = pipe(local_c8);
    if (-1 < iVar1) goto LAB_00194248;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_b0.left.ptr = (uchar *)0x0;
    local_58 = 0;
    uStack_50 = 0;
    _::Debug::Fault::init
              ((Fault *)&local_b0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_b0);
  }
LAB_00194248:
  local_d8.super_InputStream._vptr_InputStream = (_func_int **)&PTR__FdInputStream_00227700;
  local_d8.fd = local_c8[0];
  local_d8.autoclose.fd = local_c8[0];
  local_b4.fd = -1;
  OwnFd::~OwnFd(&local_b4);
  local_e8.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__FdOutputStream_00227730;
  local_e8.fd = local_c8[1];
  local_e8.autoclose.fd = local_c8[1];
  local_b8.fd = -1;
  OwnFd::~OwnFd(&local_b8);
  local_58 = 0;
  uStack_50 = 0;
  local_48 = &_::ByteLiteral<4ul>;
  local_40 = 3;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = &_::ByteLiteral<4ul>;
  local_20 = 3;
  local_18 = 0;
  uStack_10 = 0;
  FdOutputStream::write(&local_e8,(int)&local_58,&DAT_00000005,0x1d93f0);
  local_c0[4] = '\0';
  local_c0[5] = '\0';
  local_c0[0] = '\0';
  local_c0[1] = '\0';
  local_c0[2] = '\0';
  local_c0[3] = '\0';
  InputStream::read(&local_d8.super_InputStream,(int)local_c0,(void *)0x6,6);
  lVar2 = 0;
  do {
    if ((&_::ByteLiteral<7ul>)[lVar2] != local_c0[lVar2]) {
      local_b0.result = false;
      goto LAB_0019432e;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  local_b0.result = true;
LAB_0019432e:
  local_b0.left.ptr =
       "foobar/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
  ;
  local_b0.left.size_ = 6;
  local_b0.right.size_ = 6;
  local_b0.op.content.ptr = " == ";
  local_b0.op.content.size_ = 5;
  local_b0.right.ptr = local_c0;
  if ((local_b0.result == false) && (_::Debug::minSeverity < 3)) {
    local_68.ptr = 
    "foobar/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
    ;
    local_68.size_ = 6;
    local_78.size_ = 6;
    local_78.ptr = local_c0;
    _::Debug::
    log<char_const(&)[51],kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>&,kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io-test.c++"
               ,0x38,ERROR,
               "\"failed: expected \" \"(\\\"foobar\\\"_kjb) == (arrayPtr(buf))\", _kjCondition, \"foobar\"_kjb, arrayPtr(buf)"
               ,(char (*) [51])"failed: expected (\"foobar\"_kjb) == (arrayPtr(buf))",&local_b0,
               &local_68,&local_78);
  }
  FdOutputStream::~FdOutputStream(&local_e8);
  FdInputStream::~FdInputStream(&local_d8);
  return;
}

Assistant:

TEST(Io, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays are empty.  (This
  // used to not work in some cases.)

  int fds[2]{};
  KJ_SYSCALL(miniposix::pipe(fds));

  FdInputStream in((OwnFd(fds[0])));
  FdOutputStream out((OwnFd(fds[1])));

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    "foo"_kjb,
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    "bar"_kjb,
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  byte buf[6]{};
  in.read(buf);
  EXPECT_EQ("foobar"_kjb, arrayPtr(buf));
}